

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    uchar *in,size_t insize,LodePNGColorType colortype,uint bitdepth)

{
  uint uVar1;
  size_t sVar2;
  uchar *local_1e0;
  LodePNGState local_1d8;
  
  uVar1 = lodepng_decode_memory(&local_1e0,w,h,in,insize,colortype,bitdepth);
  if (uVar1 == 0 && local_1e0 != (uchar *)0x0) {
    local_1d8._vptr_LodePNGState = (_func_int **)&PTR__State_00168d68;
    local_1d8.decoder.zlibsettings.ignore_adler32 = 0;
    local_1d8.decoder.zlibsettings.custom_zlib =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0;
    local_1d8.decoder.zlibsettings.custom_inflate._0_4_ = 0;
    local_1d8.decoder.zlibsettings.custom_inflate._4_4_ = 0;
    local_1d8.decoder.zlibsettings.custom_context._0_4_ = 0;
    local_1d8.decoder._28_8_ = 0;
    local_1d8.decoder.color_convert = 1;
    local_1d8.decoder.read_text_chunks = 1;
    local_1d8.decoder.remember_unknown_chunks = 0;
    local_1d8.encoder.zlibsettings.btype = 2;
    local_1d8.encoder.zlibsettings.use_lz77 = 1;
    local_1d8.encoder.zlibsettings.windowsize = 0x800;
    local_1d8.encoder.zlibsettings.minmatch = 3;
    local_1d8.encoder.zlibsettings.nicematch = 0x80;
    local_1d8.encoder.zlibsettings.lazymatching = 1;
    local_1d8.encoder.zlibsettings.custom_zlib =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
    local_1d8.encoder.zlibsettings.custom_deflate =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
    local_1d8.encoder.zlibsettings.custom_context = (void *)0x0;
    local_1d8.encoder.filter_strategy = LFS_MINSUM;
    local_1d8.encoder.auto_convert = 1;
    local_1d8.encoder.filter_palette_zero = 1;
    local_1d8.encoder.predefined_filters = (uchar *)0x0;
    local_1d8.encoder.force_palette = 0;
    local_1d8.encoder.add_id = 0;
    local_1d8.encoder.text_compression = 1;
    local_1d8.info_raw.key_defined = 0;
    local_1d8.info_raw.key_r = 0;
    local_1d8.info_raw.key_g = 0;
    local_1d8.info_raw.key_b = 0;
    local_1d8.info_raw.palette = (uchar *)0x0;
    local_1d8.info_raw.palettesize = 0;
    local_1d8.info_png.color.key_defined = 0;
    local_1d8.info_png.color.key_r = 0;
    local_1d8.info_png.color.key_g = 0;
    local_1d8.info_png.color.key_b = 0;
    local_1d8.info_png.color.colortype = LCT_RGBA;
    local_1d8.info_png.color.bitdepth = 8;
    local_1d8.info_png.color.palette = (uchar *)0x0;
    local_1d8.info_png.color.palettesize = 0;
    local_1d8.info_png.interlace_method = 0;
    local_1d8.info_png.compression_method = 0;
    local_1d8.info_png.filter_method = 0;
    local_1d8.info_png.phys_defined = 0;
    local_1d8.info_png.unknown_chunks_size[1] = 0;
    local_1d8.info_png.unknown_chunks_size[2] = 0;
    local_1d8.info_png.unknown_chunks_data[2] = (uchar *)0x0;
    local_1d8.info_png.unknown_chunks_size[0] = 0;
    local_1d8.info_png.unknown_chunks_data[0] = (uchar *)0x0;
    local_1d8.info_png.unknown_chunks_data[1] = (uchar *)0x0;
    local_1d8.info_png.time_defined = 0;
    local_1d8.info_png.itext_transkeys = (char **)0x0;
    local_1d8.info_png.itext_strings = (char **)0x0;
    local_1d8.info_png.itext_keys = (char **)0x0;
    local_1d8.info_png.itext_langtags = (char **)0x0;
    local_1d8.info_png.text_strings = (char **)0x0;
    local_1d8.info_png.itext_num = 0;
    local_1d8.info_png.text_num = 0;
    local_1d8.info_png.text_keys = (char **)0x0;
    local_1d8.info_png.background_defined = 0;
    local_1d8.info_png.background_r = 0;
    local_1d8.info_png.background_g = 0;
    local_1d8.info_png.background_b = 0;
    local_1d8.error = 1;
    local_1d8.info_raw.bitdepth = bitdepth;
    local_1d8.info_raw.colortype = colortype;
    sVar2 = lodepng_get_raw_size(*w,*h,&local_1d8.info_raw);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,
               (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,local_1e0,local_1e0 + sVar2);
    free(local_1e0);
    local_1d8._vptr_LodePNGState = (_func_int **)&PTR__State_00168d68;
    lodepng_state_cleanup(&local_1d8);
  }
  return uVar1;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h, const unsigned char* in,
		size_t insize, LodePNGColorType colortype, unsigned bitdepth)
	{
		unsigned char* buffer;
		unsigned error = lodepng_decode_memory(&buffer, &w, &h, in, insize, colortype, bitdepth);
		if (buffer && !error)
		{
			State state;
			state.info_raw.colortype = colortype;
			state.info_raw.bitdepth = bitdepth;
			size_t buffersize = lodepng_get_raw_size(w, h, &state.info_raw);
			out.insert(out.end(), &buffer[0], &buffer[buffersize]);
			lodepng_free(buffer);
		}
		return error;
	}